

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O1

void * metacall_value_cast_buffer(void **v)

{
  type_id tVar1;
  value pvVar2;
  void *pvVar3;
  undefined8 unaff_RBX;
  type_id id;
  value unaff_retaddr;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  if (tVar1 != 8) {
    pvVar2 = value_type_cast(unaff_retaddr,id);
    if (pvVar2 != (value)0x0) {
      *v = pvVar2;
    }
  }
  pvVar3 = value_to_buffer(*v);
  return pvVar3;
}

Assistant:

void *metacall_value_cast_buffer(void **v)
{
	if (value_type_id(*v) != TYPE_BUFFER)
	{
		value v_cast = value_type_cast(*v, TYPE_BUFFER);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_buffer(*v);
}